

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

LoopLayerParams * __thiscall
CoreML::Specification::LoopLayerParams::New(LoopLayerParams *this,Arena *arena)

{
  LoopLayerParams *this_00;
  
  this_00 = (LoopLayerParams *)operator_new(0x38);
  LoopLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LoopLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

LoopLayerParams* LoopLayerParams::New(::google::protobuf::Arena* arena) const {
  LoopLayerParams* n = new LoopLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}